

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

FedObject * __thiscall MasterObjectHolder::findFed(MasterObjectHolder *this,string_view fedName)

{
  _Elt_pointer puVar1;
  element_type *peVar2;
  int iVar3;
  _Map_pointer ppuVar4;
  unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *fed;
  _Elt_pointer puVar5;
  size_t __n;
  FedObject *pFVar6;
  _Elt_pointer puVar7;
  size_type __rlen;
  handle handle;
  unique_lock<std::mutex> local_40;
  
  __n = fedName._M_len;
  local_40._M_device = &(this->feds).m_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  puVar5 = (this->feds).m_obj.
           super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  puVar1 = (this->feds).m_obj.
           super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar5 != puVar1) {
    puVar7 = (this->feds).m_obj.
             super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppuVar4 = (this->feds).m_obj.
              super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      pFVar6 = (puVar5->_M_t).
               super___uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_>.
               _M_t.
               super__Tuple_impl<0UL,_helics::FedObject_*,_std::default_delete<helics::FedObject>_>.
               super__Head_base<0UL,_helics::FedObject_*,_false>._M_head_impl;
      if (((pFVar6 != (FedObject *)0x0) &&
          (peVar2 = (pFVar6->fedptr).
                    super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
          peVar2 != (element_type *)0x0)) && (*(size_type *)((long)&peVar2->mName + 8) == __n)) {
        if (__n == 0) goto LAB_00198f85;
        iVar3 = bcmp(fedName._M_str,(peVar2->mName)._M_dataplus._M_p,__n);
        if (iVar3 == 0) goto LAB_00198f85;
      }
      puVar5 = puVar5 + 1;
      if (puVar5 == puVar7) {
        puVar5 = ppuVar4[1];
        ppuVar4 = ppuVar4 + 1;
        puVar7 = puVar5 + 0x40;
      }
    } while (puVar5 != puVar1);
  }
  pFVar6 = (FedObject *)0x0;
LAB_00198f85:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return pFVar6;
}

Assistant:

helics::FedObject* MasterObjectHolder::findFed(std::string_view fedName)
{
    auto handle = feds.lock();
    for (auto& fed : (*handle)) {
        if ((fed) && (fed->fedptr)) {
            if (fed->fedptr->getName() == fedName) {
                return fed.get();
            }
        }
    }
    return nullptr;
}